

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x942kdf.c
# Opt level: O0

int x942kdf_derive(void *vctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  int iVar1;
  int iVar2;
  EVP_MD *z_len;
  EVP_MD *in_RCX;
  uchar *unaff_RBX;
  size_t unaff_RBP;
  uchar *in_RDI;
  size_t unaff_R12;
  uchar *unaff_R13;
  size_t unaff_R14;
  uchar *unaff_R15;
  size_t in_stack_00000040;
  uchar *in_stack_00000048;
  size_t in_stack_00000050;
  uchar *in_stack_00000058;
  size_t in_stack_00000060;
  uchar *in_stack_00000068;
  size_t der_len;
  uchar *der;
  uchar *ctr;
  uchar **in_stack_00000088;
  int ret;
  EVP_MD *md;
  KDF_X942 *ctx;
  char *in_stack_ffffffffffffff10;
  char *func;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *file;
  OSSL_PARAM *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  uchar *ctr_00;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  uchar *derived_key;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  uVar3 = 0;
  ctr_00 = (uchar *)0x0;
  derived_key = in_RDI;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) ||
     (iVar1 = x942kdf_set_ctx_params(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30),
     iVar1 == 0)) {
    iVar1 = 0;
  }
  else if ((*(int *)(in_RDI + 0x98) == 0) || (*(long *)(in_RDI + 0x50) == 0)) {
    if ((*(long *)(in_RDI + 0x30) == 0) ||
       ((((*(long *)(in_RDI + 0x40) == 0 && (*(long *)(in_RDI + 0x48) == 0)) &&
         (*(long *)(in_RDI + 0x50) == 0)) && (*(long *)(in_RDI + 0x58) == 0)))) {
      if (*(long *)(in_RDI + 0x20) == 0) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
        ERR_set_error(0x39,0x84,(char *)0x0);
        iVar1 = 0;
      }
      else {
        z_len = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 8));
        if (z_len == (EVP_MD *)0x0) {
          ERR_new();
          ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
          ERR_set_error(0x39,0x81,(char *)0x0);
          iVar1 = 0;
        }
        else if ((*(long *)(in_RDI + 0x88) == 0) || (*(long *)(in_RDI + 0x90) == 0)) {
          ERR_new();
          ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
          ERR_set_error(0x39,0x90,(char *)0x0);
          iVar1 = 0;
        }
        else if ((*(long *)(in_RDI + 0x40) == 0) || (*(ulong *)(in_RDI + 0x60) < 0x40000000)) {
          func = *(char **)(in_RDI + 0x48);
          iVar1 = (int)((ulong)*(undefined8 *)(in_RDI + 0x68) >> 0x20);
          file = *(char **)(in_RDI + 0x50);
          iVar2 = x942_encode_otherinfo
                            (unaff_RBP,unaff_R15,unaff_R14,unaff_R13,unaff_R12,unaff_RBX,
                             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058
                             ,in_stack_00000060,in_stack_00000068,der_len,(uchar **)der,
                             (size_t *)ctr,in_stack_00000088);
          if (iVar2 == 0) {
            ERR_new();
            ERR_set_debug(file,iVar1,func);
            ERR_set_error(0x39,0x8d,(char *)0x0);
            iVar1 = 0;
          }
          else {
            iVar1 = x942kdf_hash_kdm(in_RCX,in_RDI,(size_t)z_len,
                                     (uchar *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff88,ctr_00,derived_key,
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
            CRYPTO_free(ctr_00);
          }
        }
        else {
          ERR_new();
          ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
          ERR_set_error(0x39,200,(char *)0x0);
          iVar1 = 0;
        }
      }
    }
    else {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
      ERR_set_error(0x39,0x73,(char *)0x0);
      iVar1 = 0;
    }
  }
  else {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff20,iVar2,in_stack_ffffffffffffff10);
    ERR_set_error(0x39,0xc6,(char *)0x0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int x942kdf_derive(void *vctx, unsigned char *key, size_t keylen,
                          const OSSL_PARAM params[])
{
    KDF_X942 *ctx = (KDF_X942 *)vctx;
    const EVP_MD *md;
    int ret = 0;
    unsigned char *ctr;
    unsigned char *der = NULL;
    size_t der_len = 0;

    if (!ossl_prov_is_running() || !x942kdf_set_ctx_params(ctx, params))
        return 0;

    /*
     * These 2 options encode to the same field so only one of them should be
     * active at once.
     */
    if (ctx->use_keybits && ctx->supp_pubinfo != NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_PUBINFO);
        return 0;
    }
    /*
     * If the blob of acvp data is used then the individual info fields that it
     * replaces should not also be defined.
     */
    if (ctx->acvpinfo != NULL
        && (ctx->partyuinfo != NULL
            || ctx->partyvinfo != NULL
            || ctx->supp_pubinfo != NULL
            || ctx->supp_privinfo != NULL)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_DATA);
        return 0;
    }
    if (ctx->secret == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_SECRET);
        return 0;
    }
    md = ossl_prov_digest_md(&ctx->digest);
    if (md == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_MESSAGE_DIGEST);
        return 0;
    }
    if (ctx->cek_oid == NULL || ctx->cek_oid_len == 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_CEK_ALG);
        return 0;
    }
    if (ctx->partyuinfo != NULL && ctx->partyuinfo_len >= X942KDF_MAX_INLEN) {
        /*
         * Note the ukm length MUST be 512 bits if it is used.
         * For backwards compatibility the old check is being done.
         */
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_UKM_LENGTH);
        return 0;
    }
    /* generate the otherinfo der */
    if (!x942_encode_otherinfo(ctx->use_keybits ? ctx->dkm_len : 0,
                               ctx->cek_oid, ctx->cek_oid_len,
                               ctx->acvpinfo, ctx->acvpinfo_len,
                               ctx->partyuinfo, ctx->partyuinfo_len,
                               ctx->partyvinfo, ctx->partyvinfo_len,
                               ctx->supp_pubinfo, ctx->supp_pubinfo_len,
                               ctx->supp_privinfo, ctx->supp_privinfo_len,
                               &der, &der_len, &ctr)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_BAD_ENCODING);
        return 0;
    }
    ret = x942kdf_hash_kdm(md, ctx->secret, ctx->secret_len,
                           der, der_len, ctr, key, keylen);
    OPENSSL_free(der);
    return ret;
}